

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

Bounds3f * __thiscall pbrt::Sphere::Bounds(Sphere *this)

{
  undefined8 in_RSI;
  Bounds3f *in_RDI;
  Bounds3f *in_stack_00000018;
  Transform *in_stack_00000020;
  Bounds3f *this_00;
  Point3<float> *in_stack_ffffffffffffffd0;
  Point3<float> *in_stack_ffffffffffffffd8;
  Bounds3<float> *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  Point3<float>::Point3(&in_RDI->pMin,(float)((ulong)in_RSI >> 0x20),(float)in_RSI,0.0);
  Point3<float>::Point3(&this_00->pMin,(float)((ulong)in_RSI >> 0x20),(float)in_RSI,0.0);
  Bounds3<float>::Bounds3
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Transform::operator()(in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

Bounds3f Sphere::Bounds() const {
    return (*renderFromObject)(
        Bounds3f(Point3f(-radius, -radius, zMin), Point3f(radius, radius, zMax)));
}